

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

UDataInfo *
getDataInfo(uint8_t *data,int32_t length,int32_t *infoLength,int32_t *headerLength,
           UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  UDataInfo *pInfo;
  DataHeader *pHeader;
  UErrorCode *pErrorCode_local;
  int32_t *headerLength_local;
  int32_t *infoLength_local;
  int32_t length_local;
  uint8_t *data_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    data_local = (uint8_t *)0x0;
  }
  else if ((data == (uint8_t *)0x0) || ((-1 < length && (length < 0x18)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    data_local = (uint8_t *)0x0;
  }
  else {
    data_local = data + 4;
    if ((((length < 0) || (0x17 < length)) && (data[2] == 0xda)) &&
       ((data[3] == '\'' && (data[10] == '\x02')))) {
      if (data[8] == '\0') {
        *headerLength = (uint)*(ushort *)data;
        *infoLength = (uint)*(ushort *)data_local;
      }
      else {
        uVar2 = readSwapUInt16(*(uint16_t *)data);
        *headerLength = (uint)uVar2;
        uVar2 = readSwapUInt16(*(uint16_t *)data_local);
        *infoLength = (uint)uVar2;
      }
      if (((*headerLength < 0x18) || (*infoLength < 0x14)) ||
         ((*headerLength < *infoLength + 4 || ((-1 < length && (length < *headerLength)))))) {
        *pErrorCode = U_UNSUPPORTED_ERROR;
        data_local = (uint8_t *)0x0;
      }
    }
    else {
      *pErrorCode = U_UNSUPPORTED_ERROR;
      data_local = (uint8_t *)0x0;
    }
  }
  return (UDataInfo *)data_local;
}

Assistant:

U_CFUNC const UDataInfo *
getDataInfo(const uint8_t *data, int32_t length,
            int32_t &infoLength, int32_t &headerLength,
            UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    const UDataInfo *pInfo;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( data==NULL ||
        (length>=0 && length<(int32_t)sizeof(DataHeader))
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    pHeader=(const DataHeader *)data;
    pInfo=&pHeader->info;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pInfo->sizeofUChar!=2
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return NULL;
    }

    if(pInfo->isBigEndian==U_IS_BIG_ENDIAN) {
        headerLength=pHeader->dataHeader.headerSize;
        infoLength=pInfo->size;
    } else {
        headerLength=readSwapUInt16(pHeader->dataHeader.headerSize);
        infoLength=readSwapUInt16(pInfo->size);
    }

    if( headerLength<(int32_t)sizeof(DataHeader) ||
        infoLength<(int32_t)sizeof(UDataInfo) ||
        headerLength<(int32_t)(sizeof(pHeader->dataHeader)+infoLength) ||
        (length>=0 && length<headerLength)
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return NULL;
    }

    return pInfo;
}